

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong_conflict
helper_precrqu_s_qb_ph_mipsel
          (target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict4 *env)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if ((int)rs < 0) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar3 = 0;
  }
  else if (rs < 0x7f810000) {
    uVar3 = rs * 2 & 0xff000000;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar3 = 0xff000000;
  }
  if ((short)rs < 0) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = 0;
  }
  else if ((rs & 0xffff) < 0x7f81) {
    uVar2 = (rs & 0x7f80) << 9;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = 0xff0000;
  }
  if ((int)rt < 0) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar5 = 0;
  }
  else if (rt < 0x7f810000) {
    uVar5 = rt >> 0xf & 0xff00;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar5 = 0xff00;
  }
  if ((short)rt < 0) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar4 = 0;
  }
  else if ((rt & 0xffff) < 0x7f81) {
    uVar4 = rt >> 7 & 0xff;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar4 = 0xff;
  }
  return uVar2 | uVar3 | uVar5 | uVar4;
}

Assistant:

target_ulong helper_precrqu_s_qb_ph(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    uint8_t  tempD, tempC, tempB, tempA;
    uint16_t rsh, rsl, rth, rtl;

    rsh = (rs & MIPSDSP_HI) >> 16;
    rsl =  rs & MIPSDSP_LO;
    rth = (rt & MIPSDSP_HI) >> 16;
    rtl =  rt & MIPSDSP_LO;

    tempD = mipsdsp_sat8_reduce_precision(rsh, env);
    tempC = mipsdsp_sat8_reduce_precision(rsl, env);
    tempB = mipsdsp_sat8_reduce_precision(rth, env);
    tempA = mipsdsp_sat8_reduce_precision(rtl, env);

    return MIPSDSP_RETURN32_8(tempD, tempC, tempB, tempA);
}